

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::Value::setSize(Value *this,size_t size)

{
  Value *pVVar1;
  ulong uVar2;
  
  if (this->type != Array) {
    __assert_fail("isArray()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                  ,0x1a1,"void cashew::Value::setSize(size_t)");
  }
  uVar2 = (((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements;
  if (uVar2 != size) {
    ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>::resize
              (&((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>,size
              );
  }
  if (uVar2 < size) {
    do {
      pVVar1 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
      pVVar1->type = Null;
      if ((((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).
          usedElements <= uVar2) {
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<cashew::ArrayStorage, cashew::Ref>::operator[](size_t) const [SubType = cashew::ArrayStorage, T = cashew::Ref]"
                     );
      }
      (((this->field_1).arr)->super_ArenaVectorBase<cashew::ArrayStorage,_cashew::Ref>).data[uVar2].
      inst = pVVar1;
      uVar2 = uVar2 + 1;
    } while (size != uVar2);
  }
  return;
}

Assistant:

void setSize(size_t size) {
    assert(isArray());
    auto old = arr->size();
    if (old != size) {
      arr->resize(size);
    }
    if (old < size) {
      for (auto i = old; i < size; i++) {
        (*arr)[i] = arena.alloc<Value>();
      }
    }
  }